

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Operator.cpp
# Opt level: O3

Type * slang::ast::OpInfo::binaryType
                 (Compilation *compilation,Type *lt,Type *rt,bool forceFourState,
                 bool signednessFromRt)

{
  bool bVar1;
  bitmask<slang::ast::IntegralFlags> bVar2;
  bitmask<slang::ast::IntegralFlags> bVar3;
  bitwidth_t bVar4;
  bitwidth_t bVar5;
  Type *pTVar6;
  SymbolKind SVar7;
  byte bVar8;
  byte bVar9;
  
  bVar1 = Type::isNumeric(lt);
  if ((!bVar1) || (bVar1 = Type::isNumeric(rt), !bVar1)) {
    return compilation->errorType;
  }
  bVar1 = Type::isMatching(lt,rt);
  if (bVar1) {
    if (!forceFourState) {
      return lt;
    }
    bVar1 = Type::isFourState(lt);
    if (bVar1) {
      return lt;
    }
    pTVar6 = lt->canonical;
    if (pTVar6 == (Type *)0x0) {
      Type::resolveCanonical(lt);
      pTVar6 = lt->canonical;
    }
    SVar7 = (pTVar6->super_Symbol).kind;
    if (SVar7 == EnumType) {
      return lt;
    }
  }
  else {
    pTVar6 = lt->canonical;
    if (pTVar6 == (Type *)0x0) {
      Type::resolveCanonical(lt);
      pTVar6 = lt->canonical;
    }
    SVar7 = (pTVar6->super_Symbol).kind;
  }
  if (SVar7 != FloatingType) {
    pTVar6 = rt->canonical;
    if (pTVar6 == (Type *)0x0) {
      Type::resolveCanonical(rt);
      pTVar6 = rt->canonical;
    }
    if ((pTVar6->super_Symbol).kind != FloatingType) {
      bVar5 = Type::getBitWidth(lt);
      bVar4 = Type::getBitWidth(rt);
      if (bVar4 < bVar5) {
        bVar4 = bVar5;
      }
      bVar2 = Type::getIntegralFlags(lt);
      bVar3 = Type::getIntegralFlags(rt);
      bVar8 = (signednessFromRt | bVar2.m_bits) & bVar3.m_bits & 1;
      bVar9 = bVar8 | 2;
      if (((bVar3.m_bits | bVar2.m_bits) & 2) != 0) {
        bVar8 = bVar9;
      }
      if (forceFourState) {
        bVar8 = bVar9;
      }
      bVar2.m_bits = bVar2.m_bits & bVar3.m_bits & 4 | bVar8;
      if (bVar4 == 1) {
        pTVar6 = lt->canonical;
        if (pTVar6 == (Type *)0x0) {
          Type::resolveCanonical(lt);
          pTVar6 = lt->canonical;
        }
        if ((pTVar6->super_Symbol).kind != ScalarType) {
          pTVar6 = rt->canonical;
          if (pTVar6 == (Type *)0x0) {
            Type::resolveCanonical(rt);
            pTVar6 = rt->canonical;
          }
          if ((pTVar6->super_Symbol).kind != ScalarType) goto LAB_0073f345;
        }
        pTVar6 = Compilation::getScalarType(compilation,bVar2);
      }
      else {
LAB_0073f345:
        pTVar6 = Compilation::getType(compilation,bVar4,bVar2);
      }
      goto LAB_0073f356;
    }
    pTVar6 = lt->canonical;
    if (pTVar6 == (Type *)0x0) {
      Type::resolveCanonical(lt);
      pTVar6 = lt->canonical;
    }
  }
  if (((pTVar6->super_Symbol).kind != FloatingType) ||
     (bVar4 = Type::getBitWidth(lt), bVar4 != 0x40)) {
    pTVar6 = rt->canonical;
    if (pTVar6 == (Type *)0x0) {
      Type::resolveCanonical(rt);
      pTVar6 = rt->canonical;
    }
    if (((pTVar6->super_Symbol).kind != FloatingType) ||
       (bVar4 = Type::getBitWidth(rt), bVar4 != 0x40)) {
      pTVar6 = compilation->shortRealType;
      goto LAB_0073f356;
    }
  }
  pTVar6 = compilation->realType;
LAB_0073f356:
  bVar1 = Type::isMatching(lt,pTVar6);
  if ((!bVar1) && (bVar1 = Type::isMatching(rt,pTVar6), lt = pTVar6, bVar1)) {
    lt = rt;
  }
  return lt;
}

Assistant:

const Type* OpInfo::binaryType(Compilation& compilation, const Type* lt, const Type* rt,
                               bool forceFourState, bool signednessFromRt) {
    if (!lt->isNumeric() || !rt->isNumeric())
        return &compilation.getErrorType();

    // If both sides are the same type just use that type.
    // NOTE: This specifically ignores the forceFourState option for enums,
    // as that better matches expectations. This area of the LRM is underspecified.
    if (lt->isMatching(*rt)) {
        if (!forceFourState || lt->isFourState() || lt->isEnum())
            return lt;
    }

    // Figure out what the result type of an arithmetic binary operator should be. The rules are:
    // - If either operand is real, the result is real
    // - Otherwise, if either operand is shortreal, the result is shortreal
    // - Otherwise, result is integral with the following properties:
    //      - Bit width is max(lhs, rhs)
    //      - If either operand is four state (or if we force it), the result is four state
    //      - If either operand is unsigned, the result is unsigned
    const Type* result;
    if (lt->isFloating() || rt->isFloating()) {
        if ((lt->isFloating() && lt->getBitWidth() == 64) ||
            (rt->isFloating() && rt->getBitWidth() == 64)) {
            result = &compilation.getRealType();
        }
        else {
            result = &compilation.getShortRealType();
        }
    }
    else {
        bitwidth_t width = std::max(lt->getBitWidth(), rt->getBitWidth());

        bitmask<IntegralFlags> lf = lt->getIntegralFlags();
        bitmask<IntegralFlags> rf = rt->getIntegralFlags();

        bitmask<IntegralFlags> flags;
        if (rf & IntegralFlags::Signed) {
            if ((lf & IntegralFlags::Signed) || signednessFromRt)
                flags |= IntegralFlags::Signed;
        }

        if (forceFourState || (lf & IntegralFlags::FourState) || (rf & IntegralFlags::FourState))
            flags |= IntegralFlags::FourState;
        if ((lf & IntegralFlags::Reg) && (rf & IntegralFlags::Reg))
            flags |= IntegralFlags::Reg;

        // If the width is 1, try to preserve whether this was a packed array with a width of 1
        // or a plain scalar type with no dimensions specified.
        if (width == 1 && (lt->isScalar() || rt->isScalar()))
            result = &compilation.getScalarType(flags);
        else
            result = &compilation.getType(width, flags);
    }

    // Attempt to preserve any type aliases passed in when selecting the result.
    if (lt->isMatching(*result))
        return lt;
    if (rt->isMatching(*result))
        return rt;

    return result;
}